

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O1

void __thiscall
ConfusableMatcher::GetMappings
          (ConfusableMatcher *this,CMStringView Key,size_t KeyPos,CMStringView Value,size_t ValuePos
          ,StackVector<std::pair<unsigned_long,_unsigned_long>_> *Storage)

{
  byte bVar1;
  vector<CMString,_std::allocator<CMString>_> *pvVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pCVar7;
  char *__s;
  ulong uVar8;
  long lVar9;
  pointer ppVar10;
  CMStringView In;
  pair<unsigned_long,_unsigned_long> In_00;
  CMStringView Compare;
  iterator foundArr;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_60;
  iterator local_48;
  
  __s = Value._M_str;
  if (Key._M_len == KeyPos) {
    __assert_fail("Key.size() - KeyPos >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0xf8,
                  "void ConfusableMatcher::GetMappings(const CMStringView, size_t, const CMStringView, size_t, StackVector<std::pair<size_t, size_t>> &)"
                 );
  }
  if (Value._M_len == ValuePos) {
    __assert_fail("Value.size() - ValuePos >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0xf9,
                  "void ConfusableMatcher::GetMappings(const CMStringView, size_t, const CMStringView, size_t, StackVector<std::pair<size_t, size_t>> &)"
                 );
  }
  bVar1 = Key._M_str[KeyPos];
  ppVar10 = this->TheMap[bVar1].
            super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (this->TheMap[bVar1].
      super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    uVar8 = 0;
    do {
      uVar6 = ppVar10[uVar8].first.Len;
      if (uVar6 <= Key._M_len - KeyPos) {
        ppVar10 = ppVar10 + uVar8;
        iVar3 = strncmp((ppVar10->first).Str,Key._M_str + KeyPos,uVar6);
        if (iVar3 == 0) {
          google::
          dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::find(&local_48,&ppVar10->second->rep,__s + ValuePos);
          local_60.ht = &ppVar10->second->rep;
          local_60.pos = (local_60.ht)->table + (local_60.ht)->num_buckets;
          local_60.end = local_60.pos;
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::advance_past_empty_and_deleted(&local_60);
          if (local_48.pos != local_60.pos) {
            pvVar2 = (local_48.pos)->second;
            pCVar7 = (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                super__Vector_impl_data._M_finish != pCVar7) {
              lVar9 = 8;
              uVar6 = 0;
              do {
                uVar5 = *(ulong *)((long)&pCVar7->Str + lVar9);
                if (uVar5 <= Value._M_len - ValuePos) {
                  if (__s == (char *)0x0) {
                    sVar4 = 0;
                  }
                  else {
                    sVar4 = strlen(__s);
                  }
                  In._M_str = __s;
                  In._M_len = sVar4;
                  Compare._M_str = *(char **)((long)pCVar7 + lVar9 + -8);
                  Compare._M_len = uVar5;
                  iVar3 = StrCompareWithSkips(this,In,ValuePos,Compare);
                  if (iVar3 != -1) {
                    In_00.second = (unsigned_long)iVar3;
                    In_00.first = (ppVar10->first).Len;
                    StackVector<std::pair<unsigned_long,_unsigned_long>_>::Push(Storage,In_00);
                  }
                }
                uVar6 = uVar6 + 1;
                pCVar7 = (pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar5 = ((long)(pvVar2->super__Vector_base<CMString,_std::allocator<CMString>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 3) *
                        -0x5555555555555555;
                lVar9 = lVar9 + 0x18;
              } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
      ppVar10 = this->TheMap[bVar1].
                super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)this->TheMap[bVar1].
                                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 5))
    ;
  }
  return;
}

Assistant:

void ConfusableMatcher::GetMappings(const CMStringView Key, size_t KeyPos, const CMStringView Value, size_t ValuePos, StackVector<std::pair<size_t, size_t>> &Storage)
{
	assert(Key.size() - KeyPos >= 1);
	assert(Value.size() - ValuePos >= 1);

	// Find array of whole keys
	const auto &vec = TheMap[(unsigned char)Key[KeyPos]];

	for (auto x = 0;x < vec.size();x++) {
		const auto &item = vec[x];

		if (item.first.Len <= Key.size() - KeyPos && strncmp(item.first.Str, Key.data() + KeyPos, item.first.Len) == 0) {
			// Whole key found, search for value array
			auto foundArr = item.second->find(Value[ValuePos]);
			if (foundArr == item.second->end())
				continue;

			const auto &secondVec = *(foundArr->second);

			for (auto i = 0;i < secondVec.size();i++) {
				const auto &secondItem = secondVec[i];

				if (secondItem.Len > Value.size() - ValuePos)
					continue;

				auto valLen = StrCompareWithSkips(Value.data(), ValuePos, secondItem.View());

				if (valLen != -1)
					Storage.Push(std::pair<size_t, size_t>((item.first).Len, valLen)); // Whole value found
			}
		}
	}
}